

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_MinipointCounterTest_OwnWindPair_TestShell::TEST_MinipointCounterTest_OwnWindPair_TestShell
          (TEST_MinipointCounterTest_OwnWindPair_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_001dbaa0;
  return;
}

Assistant:

TEST(MinipointCounterTest, OwnWindPair)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::SouthWind);

	addPair(Tile::SouthWind);
	addOpenNoPointsHandWithoutPair();
	s.winByDiscard();

	CHECK_EQUAL(22, m.total(false));
}